

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderMultisampleInterpolationTests::init
          (ShaderMultisampleInterpolationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  SingleSampleInterpolateAtSampleCase *pSVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  InterpolateAtSampleRenderCase *pIVar5;
  undefined8 *puVar6;
  MultisampleRenderCase *pMVar7;
  NegativeCompileInterpolationCase *pNVar8;
  InterpolateAtCentroidCase *pIVar9;
  InterpolateAtOffsetCase *pIVar10;
  undefined8 extraout_RAX;
  undefined8 uVar11;
  undefined8 extraout_RAX_00;
  long lVar12;
  int in_stack_ffffffffffffff78;
  allocator<char> local_71;
  TestNode *local_70;
  TestNode *local_68;
  SingleSampleInterpolateAtSampleCase *local_60;
  TestNode *local_58;
  string local_50 [32];
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "sample_qualifier","Test sample qualifier");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pTVar4 = (TestNode *)operator_new(0x128);
    anon_unknown_2::MultisampleShadeCountRenderCase::MultisampleShadeCountRenderCase
              ((MultisampleShadeCountRenderCase *)pTVar4,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12));
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__MultisampleRenderCase_01e520d8;
    pTVar4[1].m_nodeType = NODETYPE_ACCURACY;
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolate_at_sample","Test interpolateAtSample");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "static_sample_number","Test interpolateAtSample sample number");
  tcu::TestNode::addChild(pTVar3,pTVar4);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pIVar5 = (InterpolateAtSampleRenderCase *)operator_new(0x130);
    in_stack_ffffffffffffff78 = 0;
    anon_unknown_2::InterpolateAtSampleRenderCase::InterpolateAtSampleRenderCase
              (pIVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12),INDEXING_STATIC);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar5);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "dynamic_sample_number","Test interpolateAtSample sample number");
  tcu::TestNode::addChild(pTVar3,pTVar4);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pIVar5 = (InterpolateAtSampleRenderCase *)operator_new(0x130);
    in_stack_ffffffffffffff78 = 1;
    anon_unknown_2::InterpolateAtSampleRenderCase::InterpolateAtSampleRenderCase
              (pIVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12),INDEXING_DYNAMIC);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar5);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "non_multisample_buffer","Test interpolateAtSample with non-multisample buffers");
  local_70 = pTVar4;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  local_68 = pTVar3;
  local_58 = (TestNode *)this;
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    if (*(int *)(&UNK_01e51e2c + lVar12) == 0) {
      local_60 = (SingleSampleInterpolateAtSampleCase *)operator_new(0x130);
      pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      std::__cxx11::string::string<std::allocator<char>>(local_50,"sample_0_",&local_71);
      pSVar2 = local_60;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      in_stack_ffffffffffffff78 = 0;
      anon_unknown_2::SingleSampleInterpolateAtSampleCase::SingleSampleInterpolateAtSampleCase
                (pSVar2,pCVar1,(char *)*puVar6,*(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),
                 0,*(RenderTarget *)((long)&init::targets[0].name + lVar12),SAMPLE_0);
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar2);
      std::__cxx11::string::~string(local_50);
      this = (ShaderMultisampleInterpolationTests *)local_58;
      pTVar3 = local_68;
    }
  }
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    if (*(int *)(&UNK_01e51e2c + lVar12) == 0) {
      local_60 = (SingleSampleInterpolateAtSampleCase *)operator_new(0x130);
      pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      std::__cxx11::string::string<std::allocator<char>>(local_50,"sample_n_",&local_71);
      pSVar2 = local_60;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      in_stack_ffffffffffffff78 = 1;
      anon_unknown_2::SingleSampleInterpolateAtSampleCase::SingleSampleInterpolateAtSampleCase
                (pSVar2,pCVar1,(char *)*puVar6,*(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),
                 0,*(RenderTarget *)((long)&init::targets[0].name + lVar12),SAMPLE_N);
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar2);
      std::__cxx11::string::~string(local_50);
      this = (ShaderMultisampleInterpolationTests *)local_58;
      pTVar3 = local_68;
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"centroid_qualified",
             "Test interpolateAtSample with centroid qualified varying");
  tcu::TestNode::addChild(pTVar3,pTVar4);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pTVar3 = (TestNode *)operator_new(0x128);
    anon_unknown_2::CentroidRenderCase::CentroidRenderCase
              ((CentroidRenderCase *)pTVar3,
               (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12),in_stack_ffffffffffffff78);
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__MultisampleRenderCase_01e52358;
    tcu::TestNode::addChild(pTVar4,pTVar3);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,((TestNode *)this)->m_testCtx,"at_sample_id",
             "Test interpolateAtSample at current sample id");
  tcu::TestNode::addChild(local_68,pTVar3);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pMVar7 = (MultisampleRenderCase *)operator_new(0x128);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12),0x20,0);
    (pMVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_01e52498;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pMVar7);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,((TestNode *)this)->m_testCtx,"negative",
             "interpolateAtSample negative tests");
  tcu::TestNode::addChild(local_68,pTVar3);
  for (lVar12 = 0x10; lVar12 != 0x118; lVar12 = lVar12 + 0x18) {
    pNVar8 = (NegativeCompileInterpolationCase *)operator_new(0x80);
    anon_unknown_2::NegativeCompileInterpolationCase::NegativeCompileInterpolationCase
              (pNVar8,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&init::targets[0xc].numSamples + lVar12),
               *(char **)(&UNK_01e51f68 + lVar12),
               *(CaseType *)((long)&init::negativeCompileCases[0].name + lVar12),
               INTERPOLATE_AT_SAMPLE);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pNVar8);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,((TestNode *)this)->m_testCtx,"interpolate_at_centroid",
             "Test interpolateAtCentroid");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"consistency",
             "Test interpolateAtCentroid return value is consistent to centroid qualified value");
  tcu::TestNode::addChild(pTVar3,pTVar4);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pIVar9 = (InterpolateAtCentroidCase *)operator_new(0x130);
    anon_unknown_2::InterpolateAtCentroidCase::InterpolateAtCentroidCase
              (pIVar9,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12),TEST_CONSISTENCY);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar9);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"array_element",
             "Test interpolateAtCentroid with array element");
  tcu::TestNode::addChild(pTVar3,pTVar4);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pIVar9 = (InterpolateAtCentroidCase *)operator_new(0x130);
    anon_unknown_2::InterpolateAtCentroidCase::InterpolateAtCentroidCase
              (pIVar9,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12),TEST_ARRAY_ELEMENT);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar9);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"negative",
             "interpolateAtCentroid negative tests");
  tcu::TestNode::addChild(pTVar3,pTVar4);
  for (lVar12 = 0x10; lVar12 != 0x118; lVar12 = lVar12 + 0x18) {
    pNVar8 = (NegativeCompileInterpolationCase *)operator_new(0x80);
    anon_unknown_2::NegativeCompileInterpolationCase::NegativeCompileInterpolationCase
              (pNVar8,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&init::targets[0xc].numSamples + lVar12),
               *(char **)(&UNK_01e51f68 + lVar12),
               *(CaseType *)((long)&init::negativeCompileCases[0].name + lVar12),
               INTERPOLATE_AT_CENTROID);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pNVar8);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,((TestNode *)this)->m_testCtx,"interpolate_at_offset",
             "Test interpolateAtOffset");
  local_70 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)0x0;
  while( true ) {
    pTVar4 = (TestNode *)operator_new(0x70);
    if (pTVar3 == (TestNode *)0x3) break;
    local_68 = pTVar3;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,
               init::configs[(long)pTVar3].name,
               "Test interpolateAtOffset with qualified/non-qualified varying");
    tcu::TestNode::addChild(local_70,pTVar4);
    for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
      pIVar10 = (InterpolateAtOffsetCase *)operator_new(0x130);
      anon_unknown_2::InterpolateAtOffsetCase::InterpolateAtOffsetCase
                (pIVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                 *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
                 *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),
                 *(int *)(&UNK_01e51e2c + lVar12),
                 *(RenderTarget *)((long)&init::targets[0].name + lVar12),
                 init::configs[(long)pTVar3].type);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar10);
    }
    pTVar3 = (TestNode *)((long)&local_68->_vptr_TestNode + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"at_sample_position",
             "Test interpolateAtOffset at sample position");
  tcu::TestNode::addChild(local_70,pTVar4);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pMVar7 = (MultisampleRenderCase *)operator_new(0x128);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12),0x20,0);
    (pMVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_01e526c8;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar7);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,((TestNode *)this)->m_testCtx,"array_element",
             "Test interpolateAtOffset with array element");
  tcu::TestNode::addChild(local_70,pTVar3);
  for (lVar12 = 0x14; lVar12 != 0x14c; lVar12 = lVar12 + 0x18) {
    pIVar10 = (InterpolateAtOffsetCase *)operator_new(0x130);
    anon_unknown_2::InterpolateAtOffsetCase::InterpolateAtOffsetCase
              (pIVar10,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&PTR_deinit_01e51e18 + lVar12 + 4),
               *(char **)((long)&PTR_iterate_01e51e20 + lVar12 + 4),*(int *)(&UNK_01e51e2c + lVar12)
               ,*(RenderTarget *)((long)&init::targets[0].name + lVar12),TEST_ARRAY_ELEMENT);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar10);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,((TestNode *)this)->m_testCtx,"negative",
             "interpolateAtOffset negative tests");
  tcu::TestNode::addChild(local_70,pTVar3);
  uVar11 = extraout_RAX;
  for (lVar12 = 0x10; lVar12 != 0x118; lVar12 = lVar12 + 0x18) {
    pNVar8 = (NegativeCompileInterpolationCase *)operator_new(0x80);
    anon_unknown_2::NegativeCompileInterpolationCase::NegativeCompileInterpolationCase
              (pNVar8,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               *(char **)((long)&init::targets[0xc].numSamples + lVar12),
               *(char **)(&UNK_01e51f68 + lVar12),
               *(CaseType *)((long)&init::negativeCompileCases[0].name + lVar12),
               INTERPOLATE_AT_OFFSET);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pNVar8);
    uVar11 = extraout_RAX_00;
  }
  return (int)uVar11;
}

Assistant:

void ShaderMultisampleInterpolationTests::init (void)
{
	using namespace MultisampleShaderRenderUtil;

	static const struct RenderTarget
	{
		const char*							name;
		const char*							desc;
		int									numSamples;
		MultisampleRenderCase::RenderTarget	target;
	} targets[] =
	{
		{ "default_framebuffer",		"Test with default framebuffer",	0,	MultisampleRenderCase::TARGET_DEFAULT		},
		{ "singlesample_texture",		"Test with singlesample texture",	0,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_1",		"Test with multisample texture",	1,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_2",		"Test with multisample texture",	2,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_4",		"Test with multisample texture",	4,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_8",		"Test with multisample texture",	8,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_16",		"Test with multisample texture",	16,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "singlesample_rbo",			"Test with singlesample rbo",		0,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_1",			"Test with multisample rbo",		1,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_2",			"Test with multisample rbo",		2,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_4",			"Test with multisample rbo",		4,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_8",			"Test with multisample rbo",		8,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_16",			"Test with multisample rbo",		16,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
	};

	static const struct
	{
		const char*									name;
		const char*									description;
		NegativeCompileInterpolationCase::CaseType	caseType;
	} negativeCompileCases[] =
	{
		{ "vec4_identity_swizzle",		"use identity swizzle",				NegativeCompileInterpolationCase::CASE_VEC4_IDENTITY_SWIZZLE		},
		{ "vec4_crop_swizzle",			"use cropped identity swizzle",		NegativeCompileInterpolationCase::CASE_VEC4_CROP_SWIZZLE			},
		{ "vec4_mixed_swizzle",			"use swizzle",						NegativeCompileInterpolationCase::CASE_VEC4_MIXED_SWIZZLE			},
		{ "interpolate_ivec4",			"interpolate integer variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_IVEC4			},
		{ "interpolate_uvec4",			"interpolate integer variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_UVEC4			},
		{ "interpolate_array",			"interpolate whole array",			NegativeCompileInterpolationCase::CASE_INTERPOLATE_ARRAY			},
		{ "interpolate_struct",			"interpolate whole struct",			NegativeCompileInterpolationCase::CASE_INTERPOLATE_STRUCT			},
		{ "interpolate_struct_member",	"interpolate struct member",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_STRUCT_MEMBER	},
		{ "interpolate_local",			"interpolate local variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_LOCAL			},
		{ "interpolate_global",			"interpolate global variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_GLOBAL			},
		{ "interpolate_constant",		"interpolate constant variable",	NegativeCompileInterpolationCase::CASE_INTERPOLATE_CONSTANT			},
	};

	// .sample_qualifier
	{
		tcu::TestCaseGroup* const sampleQualifierGroup = new tcu::TestCaseGroup(m_testCtx, "sample_qualifier", "Test sample qualifier");
		addChild(sampleQualifierGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
			sampleQualifierGroup->addChild(new SampleQualifierRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
	}

	// .interpolate_at_sample
	{
		tcu::TestCaseGroup* const interpolateAtSampleGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_sample", "Test interpolateAtSample");
		addChild(interpolateAtSampleGroup);

		// .static_sample_number
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "static_sample_number", "Test interpolateAtSample sample number");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtSampleRenderCase::INDEXING_STATIC));
		}

		// .dynamic_sample_number
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "dynamic_sample_number", "Test interpolateAtSample sample number");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtSampleRenderCase::INDEXING_DYNAMIC));
		}

		// .non_multisample_buffer
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "non_multisample_buffer", "Test interpolateAtSample with non-multisample buffers");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				if (targets[targetNdx].numSamples == 0)
					group->addChild(new SingleSampleInterpolateAtSampleCase(m_context, std::string("sample_0_").append(targets[targetNdx].name).c_str(), targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, SingleSampleInterpolateAtSampleCase::SAMPLE_0));

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				if (targets[targetNdx].numSamples == 0)
					group->addChild(new SingleSampleInterpolateAtSampleCase(m_context, std::string("sample_n_").append(targets[targetNdx].name).c_str(), targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, SingleSampleInterpolateAtSampleCase::SAMPLE_N));
		}

		// .centroid_qualifier
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "centroid_qualified", "Test interpolateAtSample with centroid qualified varying");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new CentroidQualifierAtSampleCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .at_sample_id
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "at_sample_id", "Test interpolateAtSample at current sample id");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleIDCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtSample negative tests");
			interpolateAtSampleGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_SAMPLE));
		}
	}

	// .interpolate_at_centroid
	{
		tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_centroid", "Test interpolateAtCentroid");
		addChild(methodGroup);

		// .consistency
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "consistency", "Test interpolateAtCentroid return value is consistent to centroid qualified value");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtCentroidCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtCentroidCase::TEST_CONSISTENCY));
		}

		// .array_element
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "array_element", "Test interpolateAtCentroid with array element");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtCentroidCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtCentroidCase::TEST_ARRAY_ELEMENT));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtCentroid negative tests");
			methodGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_CENTROID));
		}
	}

	// .interpolate_at_offset
	{
		static const struct TestConfig
		{
			const char*							name;
			InterpolateAtOffsetCase::TestType	type;
		} configs[] =
		{
			{ "no_qualifiers",		InterpolateAtOffsetCase::TEST_QUALIFIER_NONE		},
			{ "centroid_qualifier",	InterpolateAtOffsetCase::TEST_QUALIFIER_CENTROID	},
			{ "sample_qualifier",	InterpolateAtOffsetCase::TEST_QUALIFIER_SAMPLE		},
		};

		tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_offset", "Test interpolateAtOffset");
		addChild(methodGroup);

		// .no_qualifiers
		// .centroid_qualifier
		// .sample_qualifier
		for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
		{
			tcu::TestCaseGroup* const qualifierGroup = new tcu::TestCaseGroup(m_testCtx, configs[configNdx].name, "Test interpolateAtOffset with qualified/non-qualified varying");
			methodGroup->addChild(qualifierGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				qualifierGroup->addChild(new InterpolateAtOffsetCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, configs[configNdx].type));
		}

		// .at_sample_position
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "at_sample_position", "Test interpolateAtOffset at sample position");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSamplePositionCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .array_element
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "array_element", "Test interpolateAtOffset with array element");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtOffsetCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtOffsetCase::TEST_ARRAY_ELEMENT));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtOffset negative tests");
			methodGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_OFFSET));
		}
	}
}